

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigReader.h
# Opt level: O1

void ParseToken(config_params *cfp,string *key,string *val)

{
  int iVar1;
  iterator __position;
  iterator __position_00;
  char *pcVar2;
  iterator __position_01;
  int iVar3;
  int *piVar4;
  long lVar5;
  istream *piVar6;
  undefined8 uVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  double dVar9;
  string token;
  stringstream is_val;
  undefined1 local_1f0 [32];
  vector<double,_std::allocator<double>_> *local_1d0;
  vector<double,_std::allocator<double>_> *local_1c8;
  string *local_1c0;
  char *local_1b8 [16];
  ios_base local_138 [264];
  
  iVar3 = std::__cxx11::string::compare((char *)key);
  if (iVar3 == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8,(string *)val,_S_out|_S_in);
    local_1f0._0_8_ = local_1f0 + 0x10;
    local_1f0._8_8_ = 0;
    local_1f0[0x10] = '\0';
    while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)local_1b8,(string *)local_1f0,','),
          ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)cfp,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0);
    }
LAB_0010bbcb:
    if ((string *)local_1f0._0_8_ == (string *)(local_1f0 + 0x10)) goto LAB_0010bbe2;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)key);
    if (iVar3 == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)local_1b8,(string *)val,_S_out|_S_in)
      ;
      local_1f0._0_8_ = local_1f0 + 0x10;
      local_1f0._8_8_ = 0;
      local_1f0[0x10] = '\0';
      local_1d0 = (vector<double,_std::allocator<double>_> *)&cfp->triangle_count;
      while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)local_1b8,(string *)local_1f0,','),
            val = (string *)local_1f0._0_8_,
            ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
        piVar4 = __errno_location();
        iVar3 = *piVar4;
        *piVar4 = 0;
        pvVar8 = (vector<double,_std::allocator<double>_> *)strtod((char *)val,(char **)&local_1c0);
        if (local_1c0 == val) {
          std::__throw_invalid_argument("stod");
LAB_0010bdc5:
          std::__throw_out_of_range("stod");
          goto LAB_0010bdd1;
        }
        if (*piVar4 == 0) {
          *piVar4 = iVar3;
        }
        else if (*piVar4 == 0x22) goto LAB_0010bdc5;
        __position._M_current =
             (cfp->triangle_count).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_1c8 = pvVar8;
        if (__position._M_current ==
            (cfp->triangle_count).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long_long,_std::allocator<long_long>_>::_M_realloc_insert<double>
                    ((vector<long_long,_std::allocator<long_long>_> *)local_1d0,__position,
                     (double *)&local_1c8);
        }
        else {
          *__position._M_current = (long)(double)pvVar8;
          (cfp->triangle_count).super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)key);
      if (iVar3 == 0) {
        pcVar2 = (val->_M_dataplus)._M_p;
        val = (string *)__errno_location();
        iVar3 = *(int *)&(val->_M_dataplus)._M_p;
        *(int *)&(val->_M_dataplus)._M_p = 0;
        lVar5 = strtol(pcVar2,local_1b8,10);
        if (local_1b8[0] == pcVar2) goto LAB_0010be01;
        if (((int)lVar5 == lVar5) && (iVar1 = *(int *)&(val->_M_dataplus)._M_p, iVar1 != 0x22)) {
          if (iVar1 == 0) {
            *(int *)&(val->_M_dataplus)._M_p = iVar3;
          }
          cfp->no_of_repeats = (int)lVar5;
          return;
        }
        goto LAB_0010be0d;
      }
      iVar3 = std::__cxx11::string::compare((char *)key);
      if (iVar3 == 0) {
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_1b8,(string *)val,_S_out|_S_in);
        local_1f0._0_8_ = local_1f0 + 0x10;
        local_1f0._8_8_ = 0;
        local_1f0[0x10] = '\0';
        local_1d0 = &cfp->sparsification_prob;
        while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)local_1b8,(string *)local_1f0,','),
              val = (string *)local_1f0._0_8_,
              ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
          piVar4 = __errno_location();
          iVar3 = *piVar4;
          *piVar4 = 0;
          pvVar8 = (vector<double,_std::allocator<double>_> *)
                   strtod((char *)val,(char **)&local_1c0);
          if (local_1c0 == val) goto LAB_0010bdd1;
          if (*piVar4 == 0) {
            *piVar4 = iVar3;
          }
          else if (*piVar4 == 0x22) goto LAB_0010bddd;
          __position_00._M_current =
               (cfp->sparsification_prob).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_1c8 = pvVar8;
          if (__position_00._M_current ==
              (cfp->sparsification_prob).super__Vector_base<double,_std::allocator<double>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (local_1d0,__position_00,(double *)&local_1c8);
          }
          else {
            *__position_00._M_current = (double)pvVar8;
            (cfp->sparsification_prob).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = __position_00._M_current + 1;
          }
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)key);
        if (iVar3 == 0) {
          pcVar2 = (val->_M_dataplus)._M_p;
          val = (string *)__errno_location();
          iVar3 = *(int *)&(val->_M_dataplus)._M_p;
          *(int *)&(val->_M_dataplus)._M_p = 0;
          dVar9 = strtod(pcVar2,local_1b8);
          if (local_1b8[0] == pcVar2) goto LAB_0010be19;
          iVar1 = *(int *)&(val->_M_dataplus)._M_p;
          if (iVar1 == 0) {
            *(int *)&(val->_M_dataplus)._M_p = iVar3;
LAB_0010bb60:
            cfp->subsample_prob = dVar9;
            return;
          }
          if (iVar1 != 0x22) goto LAB_0010bb60;
          std::__throw_out_of_range("stod");
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)key);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)key);
            if (iVar3 != 0) {
              iVar3 = std::__cxx11::string::compare((char *)key);
              if (iVar3 == 0) {
                std::__cxx11::string::_M_assign((string *)&cfp->out_directory);
                return;
              }
              iVar3 = std::__cxx11::string::compare((char *)key);
              if (iVar3 == 0) {
                iVar3 = std::__cxx11::string::compare((char *)val);
                if (iVar3 == 0) {
                  cfp->print_to_console = true;
                  return;
                }
                iVar3 = std::__cxx11::string::compare((char *)val);
                if (iVar3 == 0) {
                  cfp->print_to_console = false;
                  return;
                }
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)key);
                if (iVar3 == 0) {
                  iVar3 = std::__cxx11::string::compare((char *)val);
                  if (iVar3 == 0) {
                    cfp->print_to_file = true;
                    return;
                  }
                  iVar3 = std::__cxx11::string::compare((char *)val);
                  if (iVar3 == 0) {
                    cfp->print_to_file = false;
                    return;
                  }
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)key);
                  if (iVar3 == 0) {
                    iVar3 = std::__cxx11::string::compare((char *)val);
                    if (iVar3 == 0) {
                      cfp->edge_count_available = true;
                      return;
                    }
                    iVar3 = std::__cxx11::string::compare((char *)val);
                    if (iVar3 == 0) {
                      cfp->edge_count_available = false;
                      return;
                    }
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)key);
                    if (iVar3 == 0) {
                      iVar3 = std::__cxx11::string::compare((char *)val);
                      if (iVar3 == 0) {
                        cfp->CSS = true;
                        return;
                      }
                      iVar3 = std::__cxx11::string::compare((char *)val);
                      if (iVar3 == 0) {
                        cfp->CSS = false;
                        return;
                      }
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)key);
                      if (iVar3 == 0) {
                        iVar3 = std::__cxx11::string::compare((char *)val);
                        if (iVar3 == 0) {
                          cfp->NB = true;
                          return;
                        }
                        iVar3 = std::__cxx11::string::compare((char *)val);
                        if (iVar3 == 0) {
                          cfp->NB = false;
                          return;
                        }
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)key);
                        if (iVar3 == 0) {
                          iVar3 = std::__cxx11::string::compare((char *)val);
                          if (iVar3 == 0) {
                            cfp->degree_bin_seed = true;
                            return;
                          }
                          iVar3 = std::__cxx11::string::compare((char *)val);
                          if (iVar3 == 0) {
                            cfp->degree_bin_seed = false;
                            return;
                          }
                        }
                      }
                    }
                  }
                }
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Unknow token encountered \n",0x1a);
              return;
            }
            std::__cxx11::stringstream::stringstream
                      ((stringstream *)local_1b8,(string *)val,_S_out|_S_in);
            local_1f0._0_8_ = local_1f0 + 0x10;
            local_1f0._8_8_ = 0;
            local_1f0[0x10] = '\0';
            while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                      ((istream *)local_1b8,(string *)local_1f0,','),
                  ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string&>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &cfp->algo_names,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f0);
            }
            goto LAB_0010bbcb;
          }
        }
        std::__cxx11::stringstream::stringstream
                  ((stringstream *)local_1b8,(string *)val,_S_out|_S_in);
        local_1f0._0_8_ = local_1f0 + 0x10;
        local_1f0._8_8_ = 0;
        local_1f0[0x10] = '\0';
        local_1d0 = (vector<double,_std::allocator<double>_> *)&cfp->seed_count;
        while (piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)local_1b8,(string *)local_1f0,','),
              val = (string *)local_1f0._0_8_,
              ((byte)piVar6[*(long *)(*(long *)piVar6 + -0x18) + 0x20] & 5) == 0) {
          piVar4 = __errno_location();
          iVar3 = *piVar4;
          *piVar4 = 0;
          lVar5 = strtol((char *)val,(char **)&local_1c0,10);
          if (local_1c0 == val) goto LAB_0010bde9;
          if ((lVar5 - 0x80000000U < 0xffffffff00000000) || (*piVar4 == 0x22)) goto LAB_0010bdf5;
          if (*piVar4 == 0) {
            *piVar4 = iVar3;
          }
          local_1c8 = (vector<double,_std::allocator<double>_> *)
                      CONCAT44(local_1c8._4_4_,(int)lVar5);
          __position_01._M_current =
               (cfp->seed_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position_01._M_current ==
              (cfp->seed_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      ((vector<int,_std::allocator<int>_> *)local_1d0,__position_01,
                       (int *)&local_1c8);
          }
          else {
            *__position_01._M_current = (int)lVar5;
            (cfp->seed_count).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position_01._M_current + 1;
          }
        }
      }
    }
    if ((string *)local_1f0._0_8_ == (string *)(local_1f0 + 0x10)) goto LAB_0010bbe2;
  }
  operator_delete((void *)local_1f0._0_8_,CONCAT71(local_1f0._17_7_,local_1f0[0x10]) + 1);
LAB_0010bbe2:
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
LAB_0010bdd1:
  std::__throw_invalid_argument("stod");
LAB_0010bddd:
  std::__throw_out_of_range("stod");
LAB_0010bde9:
  std::__throw_invalid_argument("stoi");
LAB_0010bdf5:
  iVar3 = (int)piVar4;
  std::__throw_out_of_range("stoi");
LAB_0010be01:
  std::__throw_invalid_argument("stoi");
LAB_0010be0d:
  std::__throw_out_of_range("stoi");
LAB_0010be19:
  uVar7 = std::__throw_invalid_argument("stod");
  if (*(int *)&(val->_M_dataplus)._M_p == 0) {
    *(int *)&(val->_M_dataplus)._M_p = iVar3;
  }
  _Unwind_Resume(uVar7);
}

Assistant:

void ParseToken(config_params& cfp, string key, string val) {

    if (key == "input_files") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.input_files.emplace_back(token);
    }

    else if (key == "triangle_count") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.triangle_count.emplace_back(stod(token));
    }

    else if (key == "no_of_repeats")
        cfp.no_of_repeats = stoi(val, nullptr,10);

    else if (key == "sparsification_prob") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.sparsification_prob.emplace_back(stod(token));
    }

    else if (key == "subsample_prob")
        cfp.subsample_prob = stod(val);

    else if ( key == "seed_count") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.seed_count.emplace_back(stoi(token));
    }

    else if (key == "algo_names") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.algo_names.emplace_back(token);
    }

    else if (key == "out_directory") {
        cfp.out_directory = val;
    }

    else if (key == "print_to_console") {
        if (val == "true")
            cfp.print_to_console = true;
        else if (val == "false")
            cfp.print_to_console = false;
        else
            std::cout << "Unknow token encountered \n";
    }
    else if (key == "print_to_file") {
        if (val == "true")
            cfp.print_to_file = true;
        else if (val == "false")
            cfp.print_to_file = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }

    else if (key == "normalization_count_available") {
        if (val == "true")
            cfp.edge_count_available = true;
        else if (val == "false")
            cfp.edge_count_available = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }
    else if (key == "CSS") {
        if (val == "true")
            cfp.CSS = true;
        else if (val == "false")
            cfp.CSS = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }
    else if (key == "NB") {
        if (val == "true")
            cfp.NB = true;
        else if (val == "false")
            cfp.NB = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }

    else if (key == "degree_bin_seed") {
        if (val == "true")
            cfp.degree_bin_seed = true;
        else if (val == "false")
            cfp.degree_bin_seed = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }

    else
        std::cout << "Unknow token encountered \n" ;
}